

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_movec_32_rc(void)

{
  uint uVar1;
  uint uVar2;
  uint word2;
  
  if ((m68ki_cpu.cpu_type & 0x3fc) == 0) {
    m68ki_exception_illegal();
  }
  else if (m68ki_cpu.s_flag == 0) {
    m68ki_exception_privilege_violation();
  }
  else {
    uVar1 = m68ki_read_imm_16();
    uVar2 = uVar1 & 0xfff;
    if (uVar2 == 0) {
      m68ki_cpu.sfc = m68ki_cpu.dar[uVar1 >> 0xc & 0xf] & 7;
    }
    else if (uVar2 == 1) {
      m68ki_cpu.dfc = m68ki_cpu.dar[uVar1 >> 0xc & 0xf] & 7;
    }
    else if (uVar2 == 2) {
      if ((m68ki_cpu.cpu_type & 0x3f8) == 0) {
        m68ki_exception_illegal();
      }
      else if ((m68ki_cpu.cpu_type & 0x380) == 0) {
        if ((m68ki_cpu.cpu_type & 0x2e0) == 0) {
          m68ki_cpu.cacr = m68ki_cpu.dar[uVar1 >> 0xc & 0xf] & 0xf;
        }
        else {
          m68ki_cpu.cacr = m68ki_cpu.dar[uVar1 >> 0xc & 0xf] & 0xff1f;
        }
      }
      else {
        m68ki_cpu.cacr = m68ki_cpu.dar[uVar1 >> 0xc & 0xf];
      }
    }
    else if (uVar2 == 3) {
      if ((m68ki_cpu.cpu_type & 0x380) == 0) {
        m68ki_exception_illegal();
      }
    }
    else if (uVar2 == 4) {
      if ((m68ki_cpu.cpu_type & 0x380) == 0) {
        m68ki_exception_illegal();
      }
    }
    else if (uVar2 == 5) {
      if ((m68ki_cpu.cpu_type & 0x380) == 0) {
        m68ki_exception_illegal();
      }
    }
    else if (uVar2 == 6) {
      if ((m68ki_cpu.cpu_type & 0x380) == 0) {
        m68ki_exception_illegal();
      }
    }
    else if (uVar2 == 7) {
      if ((m68ki_cpu.cpu_type & 0x380) == 0) {
        m68ki_exception_illegal();
      }
    }
    else if (uVar2 == 0x800) {
      m68ki_cpu.sp[0] = m68ki_cpu.dar[uVar1 >> 0xc & 0xf];
    }
    else if (uVar2 == 0x801) {
      m68ki_cpu.vbr = m68ki_cpu.dar[uVar1 >> 0xc & 0xf];
    }
    else if (uVar2 == 0x802) {
      if ((m68ki_cpu.cpu_type & 0x3f8) == 0) {
        m68ki_exception_illegal();
      }
      else {
        m68ki_cpu.caar = m68ki_cpu.dar[uVar1 >> 0xc & 0xf];
      }
    }
    else if (uVar2 == 0x803) {
      if ((m68ki_cpu.cpu_type & 0x3f8) == 0) {
        m68ki_exception_illegal();
      }
      else if (m68ki_cpu.m_flag == 0) {
        m68ki_cpu.sp[6] = m68ki_cpu.dar[uVar1 >> 0xc & 0xf];
      }
      else {
        m68ki_cpu.dar[0xf] = m68ki_cpu.dar[uVar1 >> 0xc & 0xf];
      }
    }
    else if (uVar2 == 0x804) {
      if ((m68ki_cpu.cpu_type & 0x3f8) == 0) {
        m68ki_exception_illegal();
      }
      else if (m68ki_cpu.m_flag == 0) {
        m68ki_cpu.dar[0xf] = m68ki_cpu.dar[uVar1 >> 0xc & 0xf];
      }
      else {
        m68ki_cpu.sp[4] = m68ki_cpu.dar[uVar1 >> 0xc & 0xf];
      }
    }
    else if (uVar2 == 0x805) {
      if ((m68ki_cpu.cpu_type & 0x380) == 0) {
        m68ki_exception_illegal();
      }
    }
    else if (uVar2 == 0x806) {
      if ((m68ki_cpu.cpu_type & 0x380) == 0) {
        m68ki_exception_illegal();
      }
    }
    else if (uVar2 == 0x807) {
      if ((m68ki_cpu.cpu_type & 0x380) == 0) {
        m68ki_exception_illegal();
      }
    }
    else {
      m68ki_exception_illegal();
    }
  }
  return;
}

Assistant:

static void m68k_op_movec_32_rc(void)
{
	if(CPU_TYPE_IS_010_PLUS(CPU_TYPE))
	{
		if(FLAG_S)
		{
			uint word2 = OPER_I_16();

			m68ki_trace_t0();		   /* auto-disable (see m68kcpu.h) */
			switch (word2 & 0xfff)
			{
			case 0x000:			   /* SFC */
				REG_SFC = REG_DA[(word2 >> 12) & 15] & 7;
				return;
			case 0x001:			   /* DFC */
				REG_DFC = REG_DA[(word2 >> 12) & 15] & 7;
				return;
			case 0x002:			   /* CACR */
				/* Only EC020 and later have CACR */
				if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
				{
					/* 68030 can write all bits except 5-7, 040 can write all */
					if (CPU_TYPE_IS_040_PLUS(CPU_TYPE))
					{
						REG_CACR = REG_DA[(word2 >> 12) & 15];
					}
					else if (CPU_TYPE_IS_030_PLUS(CPU_TYPE))
					{
						REG_CACR = REG_DA[(word2 >> 12) & 15] & 0xff1f;
					}
					else
					{
						REG_CACR = REG_DA[(word2 >> 12) & 15] & 0x0f;
					}
					return;
				}
				m68ki_exception_illegal();
				return;
			case 0x800:			   /* USP */
				REG_USP = REG_DA[(word2 >> 12) & 15];
				return;
			case 0x801:			   /* VBR */
				REG_VBR = REG_DA[(word2 >> 12) & 15];
				return;
			case 0x802:			   /* CAAR */
				if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
				{
					REG_CAAR = REG_DA[(word2 >> 12) & 15];
					return;
				}
				m68ki_exception_illegal();
				return;
			case 0x803:			   /* MSP */
				if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
				{
					/* we are in supervisor mode so just check for M flag */
					if(!FLAG_M)
					{
						REG_MSP = REG_DA[(word2 >> 12) & 15];
						return;
					}
					REG_SP = REG_DA[(word2 >> 12) & 15];
					return;
				}
				m68ki_exception_illegal();
				return;
			case 0x804:			   /* ISP */
				if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
				{
					if(!FLAG_M)
					{
						REG_SP = REG_DA[(word2 >> 12) & 15];
						return;
					}
					REG_ISP = REG_DA[(word2 >> 12) & 15];
					return;
				}
				m68ki_exception_illegal();
				return;
			case 0x003:			/* TC */
				if (CPU_TYPE_IS_040_PLUS(CPU_TYPE))
				{
					/* TODO */
					return;
				}
				m68ki_exception_illegal();
				return;
			case 0x004:			/* ITT0 */
				if (CPU_TYPE_IS_040_PLUS(CPU_TYPE))
				{
					/* TODO */
					return;
				}
				m68ki_exception_illegal();
				return;
			case 0x005:			/* ITT1 */
				if (CPU_TYPE_IS_040_PLUS(CPU_TYPE))
				{
					/* TODO */
					return;
				}
				m68ki_exception_illegal();
				return;
			case 0x006:			/* DTT0 */
				if (CPU_TYPE_IS_040_PLUS(CPU_TYPE))
				{
					/* TODO */
					return;
				}
				m68ki_exception_illegal();
				return;
			case 0x007:			/* DTT1 */
				if (CPU_TYPE_IS_040_PLUS(CPU_TYPE))
				{
					/* TODO */
					return;
				}
				m68ki_exception_illegal();
				return;
			case 0x805:			/* MMUSR */
				if (CPU_TYPE_IS_040_PLUS(CPU_TYPE))
				{
					/* TODO */
					return;
				}
				m68ki_exception_illegal();
				return;
			case 0x806:			/* URP */
				if (CPU_TYPE_IS_040_PLUS(CPU_TYPE))
				{
					/* TODO */
					return;
				}
				m68ki_exception_illegal();
				return;
			case 0x807:			/* SRP */
				if (CPU_TYPE_IS_040_PLUS(CPU_TYPE))
				{
					/* TODO */
					return;
				}
				m68ki_exception_illegal();
				return;
			default:
				m68ki_exception_illegal();
				return;
			}
		}
		m68ki_exception_privilege_violation();
		return;
	}
	m68ki_exception_illegal();
}